

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

string * __thiscall re2::Prog::DumpByteMap_abi_cxx11_(Prog *this)

{
  uint uVar1;
  long in_RSI;
  string *in_RDI;
  bool bVar2;
  int hi;
  int lo;
  int b;
  int c;
  string *map;
  string local_48 [36];
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  for (local_18 = 0; uVar1 = local_18, (int)local_18 < 0x100; local_18 = local_18 + 1) {
    local_1c = (uint)*(byte *)(in_RSI + 0x90 + (long)(int)local_18);
    local_20 = local_18;
    while( true ) {
      bVar2 = false;
      if ((int)local_18 < 0xff) {
        bVar2 = *(byte *)(in_RSI + 0x90 + (long)(int)(local_18 + 1)) == local_1c;
      }
      if (!bVar2) break;
      local_18 = local_18 + 1;
    }
    local_24 = local_18;
    StringPrintf_abi_cxx11_
              ((char *)local_48,"[%02x-%02x] -> %d\n",(ulong)uVar1,(ulong)local_18,(ulong)local_1c);
    std::__cxx11::string::operator+=((string *)in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
  }
  return in_RDI;
}

Assistant:

std::string Prog::DumpByteMap() {
  std::string map;
  for (int c = 0; c < 256; c++) {
    int b = bytemap_[c];
    int lo = c;
    while (c < 256-1 && bytemap_[c+1] == b)
      c++;
    int hi = c;
    map += StringPrintf("[%02x-%02x] -> %d\n", lo, hi, b);
  }
  return map;
}